

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

void buffer_mremap(mmt_mremap *mm)

{
  cpu_mapping *pcVar1;
  ulong uVar2;
  uint8_t *puVar3;
  size_t __size;
  
  pcVar1 = cpu_mappings[mm->id];
  __size = mm->len;
  if (__size != pcVar1->length) {
    puVar3 = (uint8_t *)realloc(pcVar1->data,__size);
    pcVar1->data = puVar3;
    __size = mm->len;
    uVar2 = pcVar1->length;
    if (uVar2 <= __size && __size - uVar2 != 0) {
      memset(puVar3 + uVar2,0,__size - uVar2);
    }
  }
  pcVar1->mmap_offset = mm->offset;
  pcVar1->cpu_addr = mm->start;
  pcVar1->length = __size;
  return;
}

Assistant:

void buffer_mremap(struct mmt_mremap *mm)
{
	struct cpu_mapping *mapping = get_cpu_mapping(mm->id);
	if (mm->len != mapping->length)
	{
		mapping->data = realloc(mapping->data, mm->len);
		if (mm->len > mapping->length)
			memset(mapping->data + mapping->length, 0, mm->len - mapping->length);
	}

	mapping->mmap_offset = mm->offset;
	mapping->cpu_addr = mm->start;
	mapping->length = mm->len;
}